

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineBlocker.cpp
# Opt level: O0

void __thiscall
tiger::trains::ai::LineBlocker::changeCurrentBlock
          (LineBlocker *this,
          vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
          *points)

{
  Line *pLVar1;
  bool bVar2;
  reference ppVar3;
  reference ppLVar4;
  const_reference ppPVar5;
  Point *pPVar6;
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  *in_RSI;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_>,_bool> pVar7;
  Line *line;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *__range1_1;
  Town *homeTown;
  pair<int,_tiger::trains::ai::LineBlock> block;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  *__range1;
  Line *in_stack_fffffffffffffeb8;
  Point *in_stack_fffffffffffffec0;
  BotSharedData *in_stack_fffffffffffffec8;
  Point *in_stack_fffffffffffffed8;
  Line *in_stack_fffffffffffffee0;
  LineBlock local_d8;
  int local_c4;
  pair<int,_tiger::trains::ai::LineBlock> local_c0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  LineBlock local_98;
  int local_84;
  pair<int,_tiger::trains::ai::LineBlock> local_80;
  Line *local_68;
  Line **local_60;
  __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
  local_58;
  vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_> *local_50;
  IPost *local_48;
  undefined8 local_40;
  Line *local_38;
  Point *local_30;
  pair<int,_tiger::trains::ai::LineBlock> *local_28;
  __normal_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_*,_std::vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>_>
  local_20;
  undefined8 *local_18;
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  *local_10;
  
  local_18 = in_RDI + 10;
  local_10 = in_RSI;
  local_20._M_current =
       (pair<int,_tiger::trains::ai::LineBlock> *)
       std::
       vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
       ::begin((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                *)in_stack_fffffffffffffeb8);
  local_28 = (pair<int,_tiger::trains::ai::LineBlock> *)
             std::
             vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             ::end((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                    *)in_stack_fffffffffffffeb8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_*,_std::vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_*,_std::vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>_>
                             *)in_stack_fffffffffffffeb8), bVar2) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_*,_std::vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>_>
             ::operator*(&local_20);
    local_40 = *(undefined8 *)ppVar3;
    local_38 = (ppVar3->second).line;
    local_30 = (ppVar3->second).inPoint;
    std::
    set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
    ::erase((set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
             *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_tiger::trains::ai::LineBlock>_*,_std::vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
  ::clear((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
           *)0x252b1b);
  trains::world::Train::getPlayer((Train *)*in_RDI);
  local_48 = trains::world::Player::getHome((Player *)0x252b30);
  std::
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::operator[](local_10,1);
  local_50 = trains::world::Point::getEdges((Point *)0x252b52);
  local_58._M_current =
       (Line **)std::
                vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                ::begin((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                         *)in_stack_fffffffffffffeb8);
  local_60 = (Line **)std::
                      vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                      ::end((vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>
                             *)in_stack_fffffffffffffeb8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
                             *)in_stack_fffffffffffffeb8), bVar2) {
    ppLVar4 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
              ::operator*(&local_58);
    pLVar1 = *ppLVar4;
    local_68 = pLVar1;
    ppPVar5 = std::
              vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              ::operator[](local_10,1);
    pPVar6 = trains::world::Line::getAnotherPoint(pLVar1,*ppPVar5);
    ppPVar5 = std::
              vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              ::operator[](local_10,0);
    if (pPVar6 == *ppPVar5) {
      std::
      vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
      ::operator[](local_10,0);
      bVar2 = BotSharedData::doMove
                        (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8);
      if (bVar2) {
        local_84 = trains::world::Train::getIdx((Train *)*in_RDI);
        in_stack_fffffffffffffee0 = local_68;
        ppPVar5 = std::
                  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                  ::operator[](local_10,1);
        LineBlock::LineBlock(&local_98,in_stack_fffffffffffffee0,*ppPVar5);
        std::pair<int,_tiger::trains::ai::LineBlock>::pair<int,_true>(&local_80,&local_84,&local_98)
        ;
        std::
        vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
        ::push_back((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                     *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
        std::
        vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
        ::back((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                *)in_stack_fffffffffffffec0);
        pVar7 = std::
                set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                ::insert((set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                          *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
        local_a8 = (_Base_ptr)pVar7.first._M_node;
        local_a0 = pVar7.second;
      }
    }
    pLVar1 = local_68;
    ppPVar5 = std::
              vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              ::operator[](local_10,1);
    in_stack_fffffffffffffed8 = trains::world::Line::getAnotherPoint(pLVar1,*ppPVar5);
    ppPVar5 = std::
              vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
              ::operator[](local_10,2);
    if (in_stack_fffffffffffffed8 == *ppPVar5) {
      in_stack_fffffffffffffec0 = (Point *)(in_RDI + 10);
      local_c4 = trains::world::Train::getIdx((Train *)*in_RDI);
      in_stack_fffffffffffffeb8 = local_68;
      ppPVar5 = std::
                vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                ::operator[](local_10,0);
      LineBlock::LineBlock(&local_d8,in_stack_fffffffffffffeb8,*ppPVar5);
      std::pair<int,_tiger::trains::ai::LineBlock>::pair<int,_true>(&local_c0,&local_c4,&local_d8);
      std::
      vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ::push_back((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                   *)in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffec8 = (BotSharedData *)in_RDI[3];
      std::
      vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ::back((vector<std::pair<int,_tiger::trains::ai::LineBlock>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
              *)in_stack_fffffffffffffec0);
      std::
      set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
      ::insert((set<std::pair<int,_tiger::trains::ai::LineBlock>,_std::less<std::pair<int,_tiger::trains::ai::LineBlock>_>,_std::allocator<std::pair<int,_tiger::trains::ai::LineBlock>_>_>
                *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
    }
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Line_*const_*,_std::vector<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void LineBlocker::changeCurrentBlock(const std::vector<const world::Point *> &points)
{
    for (auto block : currentBlock)
    {
        blockLines->erase(block);
    }

    currentBlock.clear();

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    for (auto line : points[1]->getEdges())
    {

        if (line->getAnotherPoint(points[1]) == points[0])
        {
            if (sharedData->doMove(points[0], line))
            {
                currentBlock.push_back({train->getIdx(), {line, points[1]} });
                blockLines->insert(currentBlock.back());
            }
        }

        if (line->getAnotherPoint(points[1]) == points[2])
        {
            currentBlock.push_back({train->getIdx(), {line, points[0]} });
            blockLines->insert(currentBlock.back());
        }

        /* if (line->getAnotherPoint(points[1]) != points[2] &&
                 line->getAnotherPoint(points[1]) != points[0] &&
                 points[1] != homeTown->getPoint())
         {
             currentBlock.push_back({train->getIdx(), {line, line->getAnotherPoint(points[1])} });
             blockLines->insert(currentBlock.back());
         }*/

    }


}